

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.hpp
# Opt level: O2

void __thiscall Character::~Character(Character *this)

{
  long lVar1;
  
  std::_Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>::~_Vector_base
            ((_Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_> *)
             &(this->orangePortal).animation);
  std::_Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>::~_Vector_base
            ((_Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_> *)
             &(this->bluePortal).animation);
  lVar1 = 0xd8;
  do {
    std::_Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>::~_Vector_base
              ((_Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_> *)
               ((long)this->animations + lVar1 + -0x10));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Character(glm::vec2 center, glm::vec2 halfDimension)
        : AABB(center, halfDimension)
        , state(IDLE)
        , towardsLeft(false)
        , grounded(false)
        , velocity(0.0f, 0.0f)
        , runAcceleration(0.0f, 0.0f)
        , jumpAcceleration(0.0f, 0.0f)
        , invincible(false)
        , timeOfDeathInMillis(-1)
        , lives(3)
        , bluePortal(true)
        , orangePortal(false)
    {}